

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h2v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  JSAMPARRAY ppJVar1;
  byte *pbVar2;
  JSAMPROW pJVar3;
  int iVar4;
  int v;
  int outrow;
  int inrow;
  JDIMENSION colctr;
  int nextcolsum;
  int lastcolsum;
  int thiscolsum;
  JSAMPROW outptr;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPARRAY output_data;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  ppJVar1 = *output_data_ptr;
  outrow = 0;
  inrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v = v + 1) {
      pbVar2 = input_data[inrow];
      if (v == 0) {
        inptr1 = input_data[inrow + -1];
      }
      else {
        inptr1 = input_data[inrow + 1];
      }
      pJVar3 = ppJVar1[outrow];
      lastcolsum = (uint)*pbVar2 * 3 + (uint)*inptr1;
      thiscolsum = (uint)pbVar2[1] * 3 + (uint)inptr1[1];
      *pJVar3 = (JSAMPLE)(lastcolsum * 4 + 8 >> 4);
      pJVar3[1] = (JSAMPLE)(lastcolsum * 3 + thiscolsum + 7 >> 4);
      inptr1 = inptr1 + 2;
      inptr0 = pbVar2 + 2;
      for (colctr = compptr->downsampled_width - 2; outptr = pJVar3 + 2, colctr != 0;
          colctr = colctr - 1) {
        iVar4 = (uint)*inptr0 * 3 + (uint)*inptr1;
        *outptr = (JSAMPLE)(thiscolsum * 3 + lastcolsum + 8 >> 4);
        pJVar3[3] = (JSAMPLE)(thiscolsum * 3 + iVar4 + 7 >> 4);
        lastcolsum = thiscolsum;
        thiscolsum = iVar4;
        inptr1 = inptr1 + 1;
        inptr0 = inptr0 + 1;
        pJVar3 = outptr;
      }
      *outptr = (JSAMPLE)(thiscolsum * 3 + lastcolsum + 8 >> 4);
      pJVar3[3] = (JSAMPLE)(thiscolsum * 4 + 7 >> 4);
      outrow = outrow + 1;
    }
    inrow = inrow + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  register int thiscolsum, lastcolsum, nextcolsum;
#else
  register JLONG thiscolsum, lastcolsum, nextcolsum;
#endif
  register JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0)               /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
      else                      /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
      outptr = output_data[outrow++];

      /* Special case for first column */
      thiscolsum = (*inptr0++) * 3 + (*inptr1++);
      nextcolsum = (*inptr0++) * 3 + (*inptr1++);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
      lastcolsum = thiscolsum;  thiscolsum = nextcolsum;

      for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
        /* General case: 3/4 * nearer pixel + 1/4 * further pixel in each */
        /* dimension, thus 9/16, 3/16, 3/16, 1/16 overall */
        nextcolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
        lastcolsum = thiscolsum;  thiscolsum = nextcolsum;
      }

      /* Special case for last column */
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 7) >> 4);
    }
    inrow++;
  }
}